

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O2

void __thiscall
validation_layer::eventsChecker::ZEeventsChecker::resetEventInEventToDagID
          (ZEeventsChecker *this,string *zeCallDisc,ze_event_handle_t hEvent)

{
  iterator iVar1;
  iterator iVar2;
  ostream *poVar3;
  ze_event_handle_t local_20;
  
  local_20 = hEvent;
  iVar1 = std::
          _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->eventToDagID)._M_h,&local_20);
  if (iVar1.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>.
      _M_cur == (__node_type *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Warning: hSignalEvent {");
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    poVar3 = std::operator<<(poVar3,"} might be an invalid event in call to ");
    poVar3 = std::operator<<(poVar3,(string *)zeCallDisc);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else if (*(int *)((long)iVar1.
                          super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                          ._M_cur + 0x10) != -1) {
    iVar2 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->dagIDToAction)._M_h,
                   (key_type_conflict *)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                          ._M_cur + 0x10));
    if (iVar2.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      *(undefined8 *)
       ((long)iVar2.
              super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
              ._M_cur + 0x30) = 0;
    }
    *(key_type_conflict *)
     ((long)iVar1.
            super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>.
            _M_cur + 0x10) = 0xffffffff;
  }
  return;
}

Assistant:

void eventsChecker::ZEeventsChecker::resetEventInEventToDagID(
    const std::string &zeCallDisc, /// action discription
    const ze_event_handle_t hEvent ///< [in] handle of the event
) {
    auto it = eventToDagID.find(hEvent);
    // Check if user is using invalid events, hint if it doesn't exist in eventToDagID.
    if (it == eventToDagID.end()) {
        std::cerr << "Warning: hSignalEvent {" << hEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
        return;
    }

    if (it->second != invalidDagID) {

        auto action = dagIDToAction.find(it->second);
        if (action != dagIDToAction.end()) {
            action->second.second = invalidEventAddress; // Reset
        }

        it->second = invalidDagID; // Reset
    }
}